

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O2

void decryptInPlace(ThreefishKey_t *key,uint64_t *chain,uint64_t *plain_text,uint64_t num_blocks)

{
  u64b_t uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t *puVar14;
  bool bVar15;
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  
  uVar1 = key->stateSize;
  if (uVar1 == 0x400) {
    uVar5 = 0;
    uVar4 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uStack_50 = 0;
    uStack_58 = 0;
    uStack_60 = 0;
    uStack_68 = 0;
    uStack_70 = 0;
    uStack_78 = 0;
    uStack_80 = 0;
    uStack_88 = 0;
    uStack_90 = 0;
    uStack_98 = 0;
    uStack_a0 = 0;
    uStack_a8 = 0;
    uStack_b0 = 0;
    uStack_b8 = 0;
    uStack_c0 = 0;
    uStack_c8 = 0;
    uStack_d0 = 0;
    uStack_d8 = 0;
    uStack_e0 = 0;
    uStack_e8 = 0;
    uStack_f0 = 0;
    uStack_f8 = 0;
    uStack_100 = 0;
    uStack_108 = 0;
    puVar14 = plain_text;
    for (uVar6 = 0; uVar6 < num_blocks << 4; uVar6 = uVar6 + 0x10) {
      bVar15 = (uVar6 & 0x10) == 0;
      uVar13 = puVar14[1];
      if (bVar15) {
        uStack_90 = puVar14[1];
        uVar13 = uVar5;
      }
      uVar5 = uVar13;
      uVar13 = puVar14[2];
      if (bVar15) {
        uStack_98 = puVar14[2];
        uVar13 = uVar4;
      }
      uVar4 = uVar13;
      uVar13 = puVar14[3];
      if (bVar15) {
        uStack_a0 = puVar14[3];
        uVar13 = uVar7;
      }
      uVar7 = uVar13;
      uVar13 = puVar14[4];
      if (bVar15) {
        uStack_a8 = puVar14[4];
        uVar13 = uVar8;
      }
      uVar8 = uVar13;
      uVar13 = puVar14[5];
      if (bVar15) {
        uStack_b0 = puVar14[5];
        uVar13 = uVar9;
      }
      uVar9 = uVar13;
      uVar13 = puVar14[6];
      if (bVar15) {
        uStack_b8 = puVar14[6];
        uVar13 = uVar10;
      }
      uVar10 = uVar13;
      uVar13 = puVar14[7];
      if (bVar15) {
        uStack_c0 = puVar14[7];
        uVar13 = uVar11;
      }
      uVar11 = uVar13;
      uVar13 = puVar14[8];
      if (bVar15) {
        uStack_c8 = puVar14[8];
        uVar13 = uVar12;
      }
      uVar12 = uVar13;
      uVar13 = puVar14[9];
      if (bVar15) {
        uStack_d0 = puVar14[9];
        uVar13 = uStack_50;
      }
      uStack_50 = uVar13;
      uVar13 = puVar14[10];
      if (bVar15) {
        uStack_d8 = puVar14[10];
        uVar13 = uStack_58;
      }
      uStack_58 = uVar13;
      uVar13 = puVar14[0xb];
      if (bVar15) {
        uStack_e0 = puVar14[0xb];
        uVar13 = uStack_60;
      }
      uStack_60 = uVar13;
      uVar13 = puVar14[0xc];
      if (bVar15) {
        uStack_e8 = puVar14[0xc];
        uVar13 = uStack_68;
      }
      uStack_68 = uVar13;
      uVar13 = puVar14[0xd];
      if (bVar15) {
        uStack_f0 = puVar14[0xd];
        uVar13 = uStack_70;
      }
      uStack_70 = uVar13;
      uVar13 = puVar14[0xe];
      if (bVar15) {
        uStack_f8 = puVar14[0xe];
        uVar13 = uStack_78;
      }
      uStack_78 = uVar13;
      uVar13 = puVar14[0xf];
      if (bVar15) {
        uStack_100 = puVar14[0xf];
        uVar13 = uStack_80;
      }
      uStack_80 = uVar13;
      uVar13 = *puVar14;
      if (!bVar15) {
        uStack_108 = *puVar14;
        uVar13 = uStack_88;
      }
      uStack_88 = uVar13;
      threefishDecryptBlockWords(key,puVar14,puVar14);
      if (uVar6 == 0) {
        *plain_text = *plain_text ^ *chain;
        plain_text[1] = plain_text[1] ^ chain[1];
        plain_text[2] = plain_text[2] ^ chain[2];
        plain_text[3] = plain_text[3] ^ chain[3];
        plain_text[4] = plain_text[4] ^ chain[4];
        plain_text[5] = plain_text[5] ^ chain[5];
        plain_text[6] = plain_text[6] ^ chain[6];
        plain_text[7] = plain_text[7] ^ chain[7];
        plain_text[8] = plain_text[8] ^ chain[8];
        plain_text[9] = plain_text[9] ^ chain[9];
        plain_text[10] = plain_text[10] ^ chain[10];
        plain_text[0xb] = plain_text[0xb] ^ chain[0xb];
        plain_text[0xc] = plain_text[0xc] ^ chain[0xc];
        plain_text[0xd] = plain_text[0xd] ^ chain[0xd];
        plain_text[0xe] = plain_text[0xe] ^ chain[0xe];
        uVar13 = chain[0xf];
        puVar2 = plain_text + 0xf;
      }
      else if ((uVar6 & 0x10) == 0) {
        *puVar14 = *puVar14 ^ uStack_108;
        puVar14[1] = puVar14[1] ^ uVar5;
        puVar14[2] = puVar14[2] ^ uVar4;
        puVar14[3] = puVar14[3] ^ uVar7;
        puVar14[4] = puVar14[4] ^ uVar8;
        puVar14[5] = puVar14[5] ^ uVar9;
        puVar14[6] = puVar14[6] ^ uVar10;
        puVar14[7] = puVar14[7] ^ uVar11;
        puVar14[8] = puVar14[8] ^ uVar12;
        puVar14[9] = puVar14[9] ^ uStack_50;
        puVar14[10] = puVar14[10] ^ uStack_58;
        puVar14[0xb] = puVar14[0xb] ^ uStack_60;
        puVar14[0xc] = puVar14[0xc] ^ uStack_68;
        puVar14[0xd] = puVar14[0xd] ^ uStack_70;
        puVar14[0xe] = puVar14[0xe] ^ uStack_78;
        puVar2 = puVar14 + 0xf;
        uVar13 = uStack_80;
      }
      else {
        *puVar14 = *puVar14 ^ uStack_88;
        puVar14[1] = puVar14[1] ^ uStack_90;
        puVar14[2] = puVar14[2] ^ uStack_98;
        puVar14[3] = puVar14[3] ^ uStack_a0;
        puVar14[4] = puVar14[4] ^ uStack_a8;
        puVar14[5] = puVar14[5] ^ uStack_b0;
        puVar14[6] = puVar14[6] ^ uStack_b8;
        puVar14[7] = puVar14[7] ^ uStack_c0;
        puVar14[8] = puVar14[8] ^ uStack_c8;
        puVar14[9] = puVar14[9] ^ uStack_d0;
        puVar14[10] = puVar14[10] ^ uStack_d8;
        puVar14[0xb] = puVar14[0xb] ^ uStack_e0;
        puVar14[0xc] = puVar14[0xc] ^ uStack_e8;
        puVar14[0xd] = puVar14[0xd] ^ uStack_f0;
        puVar14[0xe] = puVar14[0xe] ^ uStack_f8;
        puVar2 = plain_text + uVar6 + 0xf;
        uVar13 = uStack_100;
      }
      *puVar2 = *puVar2 ^ uVar13;
      puVar14 = puVar14 + 0x10;
    }
    return;
  }
  if (uVar1 == 0x200) {
    uVar5 = 0;
    uVar4 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar6 = 0;
    uStack_60 = 0;
    uStack_68 = 0;
    uStack_70 = 0;
    uStack_78 = 0;
    uStack_80 = 0;
    uStack_88 = 0;
    uStack_90 = 0;
    puVar14 = plain_text;
    for (uVar13 = 0; uVar13 < num_blocks << 3; uVar13 = uVar13 + 8) {
      bVar15 = (uVar13 & 8) == 0;
      uVar3 = puVar14[1];
      if (bVar15) {
        uVar6 = puVar14[1];
        uVar3 = uVar5;
      }
      uVar5 = uVar3;
      uVar3 = puVar14[2];
      if (bVar15) {
        uStack_60 = puVar14[2];
        uVar3 = uVar4;
      }
      uVar4 = uVar3;
      uVar3 = puVar14[3];
      if (bVar15) {
        uStack_68 = puVar14[3];
        uVar3 = uVar7;
      }
      uVar7 = uVar3;
      uVar3 = puVar14[4];
      if (bVar15) {
        uStack_70 = puVar14[4];
        uVar3 = uVar8;
      }
      uVar8 = uVar3;
      uVar3 = puVar14[5];
      if (bVar15) {
        uStack_78 = puVar14[5];
        uVar3 = uVar9;
      }
      uVar9 = uVar3;
      uVar3 = puVar14[6];
      if (bVar15) {
        uStack_80 = puVar14[6];
        uVar3 = uVar10;
      }
      uVar10 = uVar3;
      uVar3 = puVar14[7];
      if (bVar15) {
        uStack_88 = puVar14[7];
        uVar3 = uVar11;
      }
      uVar11 = uVar3;
      uVar3 = *puVar14;
      if (!bVar15) {
        uStack_90 = *puVar14;
        uVar3 = uVar12;
      }
      uVar12 = uVar3;
      threefishDecryptBlockWords(key,puVar14,puVar14);
      if (uVar13 == 0) {
        *plain_text = *plain_text ^ *chain;
        plain_text[1] = plain_text[1] ^ chain[1];
        plain_text[2] = plain_text[2] ^ chain[2];
        plain_text[3] = plain_text[3] ^ chain[3];
        plain_text[4] = plain_text[4] ^ chain[4];
        plain_text[5] = plain_text[5] ^ chain[5];
        plain_text[6] = plain_text[6] ^ chain[6];
        uVar3 = chain[7];
        puVar2 = plain_text + 7;
      }
      else {
        puVar2 = puVar14 + 7;
        if ((uVar13 & 8) == 0) {
          *puVar14 = *puVar14 ^ uStack_90;
          puVar14[1] = puVar14[1] ^ uVar5;
          puVar14[2] = puVar14[2] ^ uVar4;
          puVar14[3] = puVar14[3] ^ uVar7;
          puVar14[4] = puVar14[4] ^ uVar8;
          puVar14[5] = puVar14[5] ^ uVar9;
          puVar14[6] = puVar14[6] ^ uVar10;
          uVar3 = uVar11;
        }
        else {
          *puVar14 = *puVar14 ^ uVar12;
          puVar14[1] = puVar14[1] ^ uVar6;
          puVar14[2] = puVar14[2] ^ uStack_60;
          puVar14[3] = puVar14[3] ^ uStack_68;
          puVar14[4] = puVar14[4] ^ uStack_70;
          puVar14[5] = puVar14[5] ^ uStack_78;
          puVar14[6] = puVar14[6] ^ uStack_80;
          uVar3 = uStack_88;
        }
      }
      *puVar2 = *puVar2 ^ uVar3;
      puVar14 = puVar14 + 8;
    }
    return;
  }
  if (uVar1 != 0x100) {
    perror("Invalid state size cannot continue\n");
    exit(9);
  }
  cbc256Decrypt(key,chain,plain_text,num_blocks);
  return;
}

Assistant:

void decryptInPlace(ThreefishKey_t* key,
                    const uint64_t* chain,
                    uint64_t* plain_text,
                    const uint64_t num_blocks)
{
    pd2("decryptInPlace(key:%lu, chain:%lu, plain_text:%lu, num_blocks:%lu)\n",
        key->key[0],
        chain[0],
        plain_text[0],
        num_blocks);

    switch(key->stateSize) //call the corresponding cbc Encrypt function
    {
        case 256: cbc256Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 512: cbc512Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 1024: cbc1024Decrypt(key, chain, plain_text, num_blocks);
        break;
        default:
        {
            perror("Invalid state size cannot continue\n");
            exit(9);
        }
        break;
    }
}